

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O1

string * __thiscall
si9ma::BinaryTree::get_space_abi_cxx11_(string *__return_storage_ptr__,BinaryTree *this,int num)

{
  uint uVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < (int)this) {
    uVar2 = (ulong)this & 0xffffffff;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

string BinaryTree::get_space(int num) {
        string res;

        for (int i = 0; i < num; ++i) {
            res += " ";
        }

        return res;
    }